

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuaternion.h
# Opt level: O0

btQuaternion __thiscall btQuaternion::operator-(btQuaternion *this)

{
  btScalar *pbVar1;
  btQuadWord *in_RDI;
  btQuaternion *q2;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  btScalar *in_stack_ffffffffffffffc8;
  btQuadWord local_10;
  
  btQuadWord::x(in_RDI);
  uVar2 = 0x80000000;
  uVar3 = 0x80000000;
  uVar4 = 0x80000000;
  uVar5 = 0x80000000;
  btQuadWord::y(in_RDI);
  pbVar1 = btQuadWord::z(in_RDI);
  btQuaternion((btQuaternion *)CONCAT44((uint)*pbVar1 ^ uVar2,(uint)in_RDI->m_floats[3] ^ uVar2),
               in_stack_ffffffffffffffc8,(btScalar *)CONCAT44(uVar5,uVar4),
               (btScalar *)CONCAT44(uVar3,uVar2),(btScalar *)0x1fe0e0);
  return (btQuadWord)(btQuadWord)local_10.m_floats;
}

Assistant:

operator-() const
	{
#if defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		return btQuaternion(_mm_xor_ps(mVec128, btvMzeroMask));
#elif defined(BT_USE_NEON)
		return btQuaternion((btSimdFloat4)veorq_s32((int32x4_t)mVec128, (int32x4_t)btvMzeroMask) );
#else	
		const btQuaternion& q2 = *this;
		return btQuaternion( - q2.x(), - q2.y(),  - q2.z(),  - q2.m_floats[3]);
#endif
	}